

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

int pr_cust(customer_t *c,int mode)

{
  int in_ESI;
  undefined8 *in_RDI;
  long tmp;
  int in_stack_00000098;
  int in_stack_0000009c;
  undefined8 in_stack_ffffffffffffffd8;
  FILE *pFVar1;
  void *in_stack_ffffffffffffffe0;
  undefined8 *data;
  FILE *target;
  
  if (pr_cust::fp == (FILE *)0x0) {
    pr_cust::fp = print_prep(in_stack_0000009c,in_stack_00000098);
  }
  target = (FILE *)*in_RDI;
  dbg_print(in_ESI,target,in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
            (int)in_stack_ffffffffffffffd8);
  dbg_print(in_ESI,target,in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
            (int)in_stack_ffffffffffffffd8);
  data = in_RDI + 5;
  pFVar1 = pr_cust::fp;
  dbg_print(in_ESI,target,data,(int)((ulong)pr_cust::fp >> 0x20),(int)pr_cust::fp);
  dbg_print(in_ESI,target,data,(int)((ulong)pFVar1 >> 0x20),(int)pFVar1);
  dbg_print(in_ESI,target,data,(int)((ulong)pFVar1 >> 0x20),(int)pFVar1);
  dbg_print(in_ESI,target,data,(int)((ulong)pFVar1 >> 0x20),(int)pFVar1);
  dbg_print(in_ESI,target,data,(int)((ulong)pFVar1 >> 0x20),(int)pFVar1);
  dbg_print(in_ESI,target,data,(int)((ulong)pFVar1 >> 0x20),(int)pFVar1);
  fprintf((FILE *)pr_cust::fp,"\n");
  return 0;
}

Assistant:

int
pr_cust(customer_t *c, int mode)
{
static FILE *fp = NULL;

   UNUSED(mode);
   if (fp == NULL)
        fp = print_prep(CUST, 0);

   PR_STRT(fp);
   PR_INT(fp, c->custkey);
   PR_VSTR(fp, c->name, C_NAME_LEN);
   PR_VSTR(fp, c->address, 
       (columnar)?(long)(ceil(C_ADDR_LEN * V_STR_HGH)):c->alen);
   PR_STR(fp, c->city,CITY_FIX);
   PR_STR(fp, c->nation_name, C_NATION_NAME_LEN);
   PR_STR(fp, c->region_name, C_REGION_NAME_LEN);
   PR_STR(fp, c->phone, PHONE_LEN);
   PR_VSTR_LAST(fp, c->mktsegment,MAXAGG_LEN);
   PR_END(fp);

   return(0);
}